

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O0

void duckdb::BinaryExecutor::
     ExecuteFlat<unsigned_long,unsigned_long,unsigned_long,duckdb::BinaryStandardOperatorWrapper,duckdb::BitwiseANDOperator,bool,false,false>
               (Vector *left,Vector *right,Vector *result,idx_t count,bool fun)

{
  bool bVar1;
  TemplatedValidityMask<unsigned_long> *this;
  TemplatedValidityMask<unsigned_long> *count_00;
  ValidityMask *pVVar2;
  Vector *in_RDX;
  undefined8 in_RDI;
  ValidityMask *unaff_retaddr;
  idx_t in_stack_00000008;
  unsigned_long *in_stack_00000010;
  unsigned_long *in_stack_00000018;
  unsigned_long *in_stack_00000020;
  ValidityMask *result_validity;
  unsigned_long *result_data;
  unsigned_long *rdata;
  unsigned_long *ldata;
  ValidityMask *in_stack_ffffffffffffff88;
  TemplatedValidityMask<unsigned_long> *other;
  undefined1 fun_00;
  
  fun_00 = (undefined1)((ulong)in_RDI >> 0x38);
  FlatVector::GetData<unsigned_long>((Vector *)0xe4511b);
  FlatVector::GetData<unsigned_long>((Vector *)0xe4512a);
  duckdb::Vector::SetVectorType((VectorType)in_RDX);
  this = (TemplatedValidityMask<unsigned_long> *)
         FlatVector::GetData<unsigned_long>((Vector *)0xe45145);
  count_00 = &FlatVector::Validity((Vector *)0xe45154)->super_TemplatedValidityMask<unsigned_long>;
  bVar1 = BinaryStandardOperatorWrapper::AddsNulls();
  if (bVar1) {
    other = count_00;
    FlatVector::Validity((Vector *)0xe4517b);
    TemplatedValidityMask<unsigned_long>::Copy(this,other,(idx_t)count_00);
    bVar1 = TemplatedValidityMask<unsigned_long>::AllValid(other);
    if (bVar1) {
      FlatVector::Validity((Vector *)0xe451b1);
      TemplatedValidityMask<unsigned_long>::Copy(this,other,(idx_t)count_00);
    }
    else {
      pVVar2 = FlatVector::Validity((Vector *)0xe451d9);
      duckdb::ValidityMask::Combine((ValidityMask *)other,(ulong)pVVar2);
    }
  }
  else {
    FlatVector::Validity((Vector *)0xe45201);
    FlatVector::SetValidity(in_RDX,in_stack_ffffffffffffff88);
    pVVar2 = FlatVector::Validity((Vector *)0xe45222);
    duckdb::ValidityMask::Combine((ValidityMask *)count_00,(ulong)pVVar2);
  }
  ExecuteFlatLoop<unsigned_long,unsigned_long,unsigned_long,duckdb::BinaryStandardOperatorWrapper,duckdb::BitwiseANDOperator,bool,false,false>
            (in_stack_00000020,in_stack_00000018,in_stack_00000010,in_stack_00000008,unaff_retaddr,
             (bool)fun_00);
  return;
}

Assistant:

static void ExecuteFlat(Vector &left, Vector &right, Vector &result, idx_t count, FUNC fun) {
		auto ldata = FlatVector::GetData<LEFT_TYPE>(left);
		auto rdata = FlatVector::GetData<RIGHT_TYPE>(right);

		if ((LEFT_CONSTANT && ConstantVector::IsNull(left)) || (RIGHT_CONSTANT && ConstantVector::IsNull(right))) {
			// either left or right is constant NULL: result is constant NULL
			result.SetVectorType(VectorType::CONSTANT_VECTOR);
			ConstantVector::SetNull(result, true);
			return;
		}

		result.SetVectorType(VectorType::FLAT_VECTOR);
		auto result_data = FlatVector::GetData<RESULT_TYPE>(result);
		auto &result_validity = FlatVector::Validity(result);
		if (LEFT_CONSTANT) {
			if (OPWRAPPER::AddsNulls()) {
				result_validity.Copy(FlatVector::Validity(right), count);
			} else {
				FlatVector::SetValidity(result, FlatVector::Validity(right));
			}
		} else if (RIGHT_CONSTANT) {
			if (OPWRAPPER::AddsNulls()) {
				result_validity.Copy(FlatVector::Validity(left), count);
			} else {
				FlatVector::SetValidity(result, FlatVector::Validity(left));
			}
		} else {
			if (OPWRAPPER::AddsNulls()) {
				result_validity.Copy(FlatVector::Validity(left), count);
				if (result_validity.AllValid()) {
					result_validity.Copy(FlatVector::Validity(right), count);
				} else {
					result_validity.Combine(FlatVector::Validity(right), count);
				}
			} else {
				FlatVector::SetValidity(result, FlatVector::Validity(left));
				result_validity.Combine(FlatVector::Validity(right), count);
			}
		}
		ExecuteFlatLoop<LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE, OPWRAPPER, OP, FUNC, LEFT_CONSTANT, RIGHT_CONSTANT>(
		    ldata, rdata, result_data, count, result_validity, fun);
	}